

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_cipher_generate_iv
          (psa_cipher_operation_t *operation,uint8_t *iv,size_t iv_size,size_t *iv_length)

{
  int ret_00;
  int local_34;
  int ret;
  psa_status_t status;
  size_t *iv_length_local;
  size_t iv_size_local;
  uint8_t *iv_local;
  psa_cipher_operation_t *operation_local;
  
  if ((((byte)operation->field_0x4 >> 2 & 1) == 0) && (((byte)operation->field_0x4 >> 1 & 1) != 0))
  {
    if (iv_size < operation->iv_size) {
      local_34 = -0x8a;
    }
    else {
      ret_00 = mbedtls_ctr_drbg_random(&global_data.ctr_drbg,iv,(ulong)operation->iv_size);
      if (ret_00 == 0) {
        *iv_length = (ulong)operation->iv_size;
        local_34 = psa_cipher_set_iv(operation,iv,*iv_length);
      }
      else {
        local_34 = mbedtls_to_psa_error(ret_00);
      }
    }
    if (local_34 != 0) {
      psa_cipher_abort(operation);
    }
    operation_local._4_4_ = local_34;
  }
  else {
    operation_local._4_4_ = -0x89;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_cipher_generate_iv( psa_cipher_operation_t *operation,
                                     uint8_t *iv,
                                     size_t iv_size,
                                     size_t *iv_length )
{
    psa_status_t status;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    if( operation->iv_set || ! operation->iv_required )
    {
        return( PSA_ERROR_BAD_STATE );
    }
    if( iv_size < operation->iv_size )
    {
        status = PSA_ERROR_BUFFER_TOO_SMALL;
        goto exit;
    }
    ret = mbedtls_ctr_drbg_random( &global_data.ctr_drbg,
                                   iv, operation->iv_size );
    if( ret != 0 )
    {
        status = mbedtls_to_psa_error( ret );
        goto exit;
    }

    *iv_length = operation->iv_size;
    status = psa_cipher_set_iv( operation, iv, *iv_length );

exit:
    if( status != PSA_SUCCESS )
        psa_cipher_abort( operation );
    return( status );
}